

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lace.h
# Opt level: O0

int lace_shrink_shared(WorkerP *w)

{
  Worker *pWVar1;
  __int_type _Var2;
  __int_type_conflict _Var3;
  uint local_34;
  uint32_t newsplit;
  uint32_t split;
  uint32_t tail;
  TailSplitNA ts;
  Worker *wt;
  WorkerP *w_local;
  
  pWVar1 = w->_public;
  _Var3 = std::__atomic_base::operator_cast_to_unsigned_long((__atomic_base *)&(pWVar1->ts).ts);
  split = (uint32_t)_Var3;
  tail = (uint32_t)(_Var3 >> 0x20);
  if (split != tail) {
    local_34 = split + tail >> 1;
    std::atomic_store_explicit<unsigned_int>(&(pWVar1->ts).ts.split,local_34,memory_order_relaxed);
    _Var2 = std::__atomic_base::operator_cast_to_unsigned_int((__atomic_base *)&(pWVar1->ts).ts);
    if (_Var2 != tail) {
      if (local_34 < _Var2) {
        local_34 = _Var2 + tail >> 1;
        std::atomic_store_explicit<unsigned_int>
                  (&(pWVar1->ts).ts.split,local_34,memory_order_relaxed);
      }
      w->split = w->dq + local_34;
      return 0;
    }
  }
  pWVar1->allstolen = '\x01';
  w->allstolen = '\x01';
  return 1;
}

Assistant:

static int
lace_shrink_shared(WorkerP *w)
{
    Worker *wt = w->_public;
    TailSplitNA ts; /* Use non-atomic version to emit better code */
    ts.v = wt->ts.v; /* Force in 1 memory read */
    uint32_t tail = ts.ts.tail;
    uint32_t split = ts.ts.split;

    if (tail != split) {
        uint32_t newsplit = (tail + split)/2;
        atomic_store_explicit(&wt->ts.ts.split, newsplit, memory_order_relaxed); /* emit normal write */
        atomic_thread_fence(memory_order_seq_cst);
        tail = wt->ts.ts.tail;
        if (tail != split) {
            if (unlikely(tail > newsplit)) {
                newsplit = (tail + split) / 2;
                atomic_store_explicit(&wt->ts.ts.split, newsplit, memory_order_relaxed); /* emit normal write */
            }
            w->split = w->dq + newsplit;
            PR_COUNTSPLITS(w, CTR_split_shrink);
            return 0;
        }
    }

    wt->allstolen = 1;
    w->allstolen = 1;
    return 1;
}